

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  MethodGroup *this_00;
  char *name_00;
  char *descr;
  TestNode *pTVar1;
  DrawMethod method;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined1 local_70 [8];
  string desc;
  string name;
  DrawMethod DStack_28;
  int ndx;
  DrawMethod basicMethods [5];
  DrawTests *this_local;
  
  stack0xfffffffffffffff0 = this;
  _DStack_28 = 0x300000000;
  basicMethods[0] = DRAWMETHOD_DRAWARRAYS_INSTANCED;
  basicMethods[1] = DRAWMETHOD_DRAWELEMENTS_INSTANCED;
  basicMethods[2] = DRAWMETHOD_DRAWELEMENTS_RANGED;
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 5;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)(&DStack_28)[(int)name.field_2._12_4_],(DrawMethod)in_RDX);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)local_70,(DrawTestSpec *)(ulong)(&DStack_28)[(int)name.field_2._12_4_],
               method);
    this_00 = (MethodGroup *)operator_new(0x80);
    context = (this->super_TestCaseGroup).m_context;
    name_00 = (char *)std::__cxx11::string::c_str();
    descr = (char *)std::__cxx11::string::c_str();
    anon_unknown_0::MethodGroup::MethodGroup
              (this_00,context,name_00,descr,(&DStack_28)[(int)name.field_2._12_4_]);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    in_RDX = extraout_RDX;
  }
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_0::InstancingGroup::InstancingGroup
            ((InstancingGroup *)pTVar1,(this->super_TestCaseGroup).m_context,"instancing",
             "draw tests with a large instance count.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_0::RandomGroup::RandomGroup
            ((RandomGroup *)pTVar1,(this->super_TestCaseGroup).m_context,"random",
             "random draw commands.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	// Basic
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			const std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			const std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			this->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}
	}

	// extreme instancing

	this->addChild(new InstancingGroup(m_context, "instancing", "draw tests with a large instance count."));

	// Random

	this->addChild(new RandomGroup(m_context, "random", "random draw commands."));
}